

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab1-1.c
# Opt level: O0

int feederBig(void)

{
  DWORD DVar1;
  int iVar2;
  DWORD DVar3;
  uint uVar4;
  FILE *__stream;
  int local_1c;
  DWORD t;
  int i;
  FILE *in;
  
  __stream = fopen("in.txt","w+");
  if (__stream == (FILE *)0x0) {
    printf("can\'t create in.txt. No space on disk?\n");
    in._4_4_ = -1;
  }
  else {
    printf("Creating large text... ");
    fflush(_stdout);
    DVar1 = GetTickCount();
    fprintf(__stream,"0123456789abcdef\n");
    for (local_1c = 1; local_1c < 0x800000; local_1c = local_1c + 1) {
      iVar2 = fprintf(__stream,"0123456789abcde\n");
      if (iVar2 == -1) {
        printf("can\'t create in.txt. No space on disk?\n");
        fclose(__stream);
        return -1;
      }
    }
    fprintf(__stream,"0123456789abcdef");
    fclose(__stream);
    DVar3 = GetTickCount();
    uVar4 = RoundUptoThousand(DVar3 - DVar1);
    printf("done in T=%u seconds. Starting exe with timeout 2*T... ",(ulong)uVar4 / 1000,
           (ulong)uVar4 % 1000);
    LabTimeout = uVar4 << 1;
    fflush(_stdout);
    in._4_4_ = 0;
  }
  return in._4_4_;
}

Assistant:

static int feederBig(void)
{
    FILE *const in = fopen("in.txt", "w+");
    int i;
    DWORD t;
    if (!in) {
        printf("can't create in.txt. No space on disk?\n");
        return -1;
    }
    printf("Creating large text... ");
    fflush(stdout);
    t = GetTickCount();
    fprintf(in, "0123456789abcdef\n");
    for (i = 1; i < 1024*1024*8; i++) {
        if (fprintf(in, "0123456789abcde\n") == EOF) {
            printf("can't create in.txt. No space on disk?\n");
            fclose(in);
            return -1;
        }
    }
    fprintf(in, "0123456789abcdef");
    fclose(in);
    t = RoundUptoThousand(GetTickCount() - t);
    printf("done in T=%u seconds. Starting exe with timeout 2*T... ", (unsigned)t/1000);
    LabTimeout = (int)t*2;
    fflush(stdout);
    return 0;
}